

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4ebe96::BNTest_ASN1_Test::TestBody(BNTest_ASN1_Test *this)

{
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  _Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  undefined8 extraout_RAX;
  ulong uVar5;
  BIGNUM *ret;
  long lVar6;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var7;
  char *pcVar8;
  _Head_base<0UL,_bignum_st_*,_false> in_R9;
  bool bVar9;
  ScopedTrace gtest_trace_1423;
  UniquePtr<BIGNUM> bn;
  AssertionResult gtest_ar_;
  CBS cbs;
  UniquePtr<BIGNUM> bn_1;
  ScopedCBB cbb;
  UniquePtr<BIGNUM> bn2;
  UniquePtr<uint8_t> delete_der;
  size_t der_len;
  uint8_t *der;
  ScopedTrace local_e9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e8;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  undefined1 local_b8 [8];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  Bytes local_a8;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_98;
  undefined1 local_90 [16];
  anon_union_32_2_4f6aaa2e_for_u local_80;
  _Head_base<0UL,_bignum_st_*,_false> local_60;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_58;
  long local_50;
  ulong local_48;
  size_t local_40;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  lVar6 = 0x10;
  uVar5 = 0;
  do {
    pcVar8 = *(char **)((long)&PTR_typeinfo_006fc4e0 + lVar6);
    local_50 = lVar6;
    local_48 = uVar5;
    testing::ScopedTrace::ScopedTrace
              (&local_e9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x58f,pcVar8);
    local_90._0_8_ = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    iVar4 = BN_asc2bn((BIGNUM **)local_90,pcVar8);
    local_98._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)local_90._0_8_;
    if (iVar4 == 0) {
      local_98._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
           (anon_union_32_2_4f6aaa2e_for_u *)0x0;
    }
    local_d8[0] = (internal)
                  ((tuple<bignum_st_*,_bssl::internal::Deleter>)
                   local_98._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_bignum_st_*,_false>)0x0);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((tuple<bignum_st_*,_bssl::internal::Deleter>)
        local_98._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_bignum_st_*,_false>)0x0) {
      testing::Message::Message((Message *)local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_d8,(AssertionResult *)0x55e5dc,"false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x591,(char *)local_90._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80.base.buf + 1));
      }
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
LAB_002bf6b5:
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_98);
      testing::ScopedTrace::~ScopedTrace(&local_e9);
LAB_002bf6c9:
      if ((local_48 & 1) == 0) {
        return;
      }
      break;
    }
    local_60._M_head_impl = (bignum_st *)BN_new();
    local_d8[0] = (internal)((BIGNUM *)local_60._M_head_impl != (BIGNUM *)0x0);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((BIGNUM *)local_60._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_d8,(AssertionResult *)"bn2","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x595,(char *)local_90._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      _Var7._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80.base.buf + 1));
        _Var7._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
      }
LAB_002bf689:
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )_Var7._M_head_impl !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)_Var7._M_head_impl + 8))();
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_60);
      goto LAB_002bf6b5;
    }
    uVar1._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(&UNK_006fc4e8 + local_50))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    _Var2.
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&(anonymous_namespace)::kASN1Tests + local_50))->
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ;
    local_b8 = (undefined1  [8])
               uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_b0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )_Var2;
    iVar4 = BN_parse_asn1_unsigned((CBS *)local_b8,local_60._M_head_impl);
    local_d8[0] = (internal)(iVar4 != 0);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_d8,
                 (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn2.get())","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x598,(char *)local_90._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      _Var7._M_head_impl = local_e8._M_head_impl;
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80.base.buf + 1));
        _Var7._M_head_impl = local_e8._M_head_impl;
      }
      goto LAB_002bf689;
    }
    local_e8._M_head_impl = local_e8._M_head_impl & 0xffffffff00000000;
    local_d8 = (undefined1  [8])
               local_b0._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_90,"0u","CBS_len(&cbs)",(uint *)&local_e8,(unsigned_long *)local_d8
              );
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)local_d8);
      pcVar8 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = ((_Alloc_hider *)local_90._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x599,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_d8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_d8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
    in_R9._M_head_impl = local_60._M_head_impl;
    AssertBIGNUMSEqual((char *)local_90,"bn.get()","bn2.get()","decode ASN.1",
                       (BIGNUM *)
                       local_98._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,local_60._M_head_impl)
    ;
    if (local_90[0] == '\0') {
      testing::Message::Message((Message *)local_d8);
      pcVar8 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = ((_Alloc_hider *)local_90._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x59a,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)local_d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
      if (local_d8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_d8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_90 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_90._8_8_);
    }
    CBB_zero((CBB *)local_90);
    iVar4 = CBB_init((CBB *)local_90,0);
    local_e8._M_head_impl._0_1_ = iVar4 != 0;
    local_e0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)&local_e8,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5a0,(char *)local_d8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a8);
LAB_002bf422:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
      if (local_d8 != (undefined1  [8])&local_c8) {
        operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
      }
      if ((long *)local_a8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a8.span_.data_ + 8))();
      }
      if (local_e0._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_e0._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
      bVar9 = false;
    }
    else {
      iVar4 = BN_marshal_asn1((CBB *)local_90,
                              (BIGNUM *)
                              local_98._M_t.
                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
      local_e8._M_head_impl._0_1_ = iVar4 != 0;
      local_e0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)&local_e8,
                   (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","false","true",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a1,(char *)local_d8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a8);
        goto LAB_002bf422;
      }
      iVar4 = CBB_finish((CBB *)local_90,&local_38._M_head_impl,&local_40);
      local_e8._M_head_impl._0_1_ = iVar4 != 0;
      local_e0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&local_a8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)&local_e8,
                   (AssertionResult *)"CBB_finish(cbb.get(), &der, &der_len)","false","true",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a2,(char *)local_d8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_a8);
        goto LAB_002bf422;
      }
      local_58._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           local_38._M_head_impl;
      local_a8.span_.data_ = local_38._M_head_impl;
      local_a8.span_.size_ = local_40;
      local_e8._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           uVar1._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      local_e0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )_Var2;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)local_d8,"Bytes(test.der, test.der_len)","Bytes(der, der_len)",
                 (Bytes *)&local_e8,&local_a8);
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_e8);
        pcVar8 = "";
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = (local_d0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5a4,pcVar8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
        if ((BIGNUM *)local_e8._M_head_impl != (BIGNUM *)0x0) {
          (**(code **)(*(long *)local_e8._M_head_impl + 8))();
        }
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_58);
      bVar9 = true;
    }
    CBB_cleanup((CBB *)local_90);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_60);
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_98);
    testing::ScopedTrace::~ScopedTrace(&local_e9);
    if (!bVar9) goto LAB_002bf6c9;
    lVar6 = local_50 + 0x18;
    uVar5 = CONCAT71((int7)((ulong)extraout_RAX >> 8),lVar6 == 0xb8);
  } while (lVar6 != 0xb8);
  lVar6 = 8;
  bVar9 = false;
  do {
    uVar1._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                *)(&UNK_006fc598 + lVar6))->
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)&(anonymous_namespace)::kASN1InvalidTests + lVar6);
    local_90._0_8_ =
         uVar1._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    local_90._8_8_ = pbVar3;
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x5a8,(Bytes *)local_90);
    ret = BN_new();
    local_d8[0] = (internal)(ret != (BIGNUM *)0x0);
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)ret;
    if (ret == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_d8,(AssertionResult *)0x55e5dc,"false","true",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5aa,(char *)local_90._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80.base.buf + 1));
      }
      if (local_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_b8 + 8))();
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_e8);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_60);
LAB_002bf925:
      if (!bVar9) {
        return;
      }
      break;
    }
    local_d8 = (undefined1  [8])
               uVar1._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_d0 = pbVar3;
    iVar4 = BN_parse_asn1_unsigned((CBS *)local_d8,(BIGNUM *)ret);
    local_b8[0] = iVar4 == 0;
    local_b0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_a8.span_.data_ + 0x10),"Parsed invalid input.",0x15);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_90,(internal *)local_b8,
                 (AssertionResult *)"BN_parse_asn1_unsigned(&cbs, bn.get())","true","false",
                 (char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5ad,(char *)local_90._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_90._0_8_ != &local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80.base.buf + 1));
      }
      if ((long *)local_a8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a8.span_.data_ + 8))();
      }
    }
    if (local_b0._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_b0._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    ERR_clear_error();
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_e8);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_60);
    if (ret == (BIGNUM *)0x0) goto LAB_002bf925;
    lVar6 = lVar6 + 0x10;
    bVar9 = lVar6 == 0x58;
  } while (!bVar9);
  local_90._0_8_ = (anon_union_32_2_4f6aaa2e_for_u *)0x0;
  iVar4 = BN_asc2bn((BIGNUM **)local_90,"-1");
  local_e8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90._0_8_;
  if (iVar4 == 0) {
    local_e8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (anon_union_32_2_4f6aaa2e_for_u *)0x0;
  }
  local_d8[0] = (internal)
                ((anon_union_32_2_4f6aaa2e_for_u *)local_e8._M_head_impl !=
                (anon_union_32_2_4f6aaa2e_for_u *)0x0);
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_32_2_4f6aaa2e_for_u *)local_e8._M_head_impl ==
      (anon_union_32_2_4f6aaa2e_for_u *)0x0) {
    testing::Message::Message((Message *)local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_d8,(AssertionResult *)0x55e5dc,"false","true",
               (char *)in_R9._M_head_impl);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x5b4,(char *)local_90._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_32_2_4f6aaa2e_for_u *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80.base.buf + 1));
    }
    if (local_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b8 + 8))();
    }
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
  }
  else {
    CBB_zero((CBB *)local_90);
    iVar4 = CBB_init((CBB *)local_90,0);
    local_b8[0] = iVar4 != 0;
    local_b0._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)local_b8,(AssertionResult *)"CBB_init(cbb.get(), 0)"
                 ,"false","true",(char *)in_R9._M_head_impl);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x5b6,(char *)local_d8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if (local_d8 != (undefined1  [8])&local_c8) {
        operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
      }
      if ((long *)local_a8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a8.span_.data_ + 8))();
      }
      if (local_b0._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_b0._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
    }
    else {
      iVar4 = BN_marshal_asn1((CBB *)local_90,(BIGNUM *)local_e8._M_head_impl);
      local_b8[0] = iVar4 == 0;
      local_b0._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (iVar4 != 0) {
        testing::Message::Message((Message *)&local_a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_a8.span_.data_ + 0x10),"Serialized negative number.",0x1b
                  );
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_b8,
                   (AssertionResult *)"BN_marshal_asn1(cbb.get(), bn.get())","true","false",
                   (char *)in_R9._M_head_impl);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x5b7,(char *)local_d8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
        if (local_d8 != (undefined1  [8])&local_c8) {
          operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
        }
        if ((long *)local_a8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_a8.span_.data_ + 8))();
        }
      }
      if (local_b0._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_b0._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
      }
      ERR_clear_error();
    }
    CBB_cleanup((CBB *)local_90);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_e8);
  return;
}

Assistant:

TEST_F(BNTest, ASN1) {
  for (const ASN1Test &test : kASN1Tests) {
    SCOPED_TRACE(test.value_ascii);
    bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM(test.value_ascii);
    ASSERT_TRUE(bn);

    // Test that the input is correctly parsed.
    bssl::UniquePtr<BIGNUM> bn2(BN_new());
    ASSERT_TRUE(bn2);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    ASSERT_TRUE(BN_parse_asn1_unsigned(&cbs, bn2.get()));
    EXPECT_EQ(0u, CBS_len(&cbs));
    EXPECT_BIGNUMS_EQUAL("decode ASN.1", bn.get(), bn2.get());

    // Test the value serializes correctly.
    bssl::ScopedCBB cbb;
    uint8_t *der;
    size_t der_len;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(BN_marshal_asn1(cbb.get(), bn.get()));
    ASSERT_TRUE(CBB_finish(cbb.get(), &der, &der_len));
    bssl::UniquePtr<uint8_t> delete_der(der);
    EXPECT_EQ(Bytes(test.der, test.der_len), Bytes(der, der_len));
  }

  for (const ASN1InvalidTest &test : kASN1InvalidTests) {
    SCOPED_TRACE(Bytes(test.der, test.der_len));
    bssl::UniquePtr<BIGNUM> bn(BN_new());
    ASSERT_TRUE(bn);
    CBS cbs;
    CBS_init(&cbs, reinterpret_cast<const uint8_t *>(test.der), test.der_len);
    EXPECT_FALSE(BN_parse_asn1_unsigned(&cbs, bn.get()))
        << "Parsed invalid input.";
    ERR_clear_error();
  }

  // Serializing negative numbers is not supported.
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("-1");
  ASSERT_TRUE(bn);
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  EXPECT_FALSE(BN_marshal_asn1(cbb.get(), bn.get()))
      << "Serialized negative number.";
  ERR_clear_error();
}